

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr
GetFunctionNameInScope
          (ExpressionContext *ctx,ScopeData *scope,TypeBase *parentType,InplaceStr str,
          bool isOperator,bool isAccessor)

{
  NamespaceData *pNVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar5;
  ScopeData *pSVar6;
  undefined4 extraout_var_00;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  ScopeData *curr;
  InplaceStr IVar13;
  char *pcVar4;
  
  pcVar10 = str.end;
  pcVar7 = str.begin;
  if (parentType == (TypeBase *)0x0) {
    if (!isOperator) {
      if (isAccessor) {
        __assert_fail("!isAccessor",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                      ,0x256,
                      "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                     );
      }
      uVar11 = (int)str.end - (int)str.begin;
      bVar2 = false;
      uVar9 = uVar11;
      for (pSVar6 = scope; pSVar6 != (ScopeData *)0x0; pSVar6 = pSVar6->scope) {
        if ((pSVar6->type == SCOPE_TEMPORARY) ||
           ((pSVar6->ownerFunction != (FunctionData *)0x0 && (!bVar2)))) goto LAB_00206c7c;
        if ((pSVar6->ownerType != (TypeBase *)0x0) && (!bVar2)) {
          __assert_fail("foundNamespace",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                        ,0x267,
                        "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                       );
        }
        pNVar1 = pSVar6->ownerNamespace;
        if (pNVar1 != (NamespaceData *)0x0) {
          uVar9 = uVar9 + (*(int *)&(pNVar1->name).name.end - *(int *)&(pNVar1->name).name.begin) +
                  1;
          bVar2 = true;
        }
      }
      if (bVar2) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar9 + 1));
        pcVar4 = (char *)CONCAT44(extraout_var_00,iVar3);
        pcVar4[(ulong)(uVar9 + 1) - 1] = '\0';
        pcVar10 = pcVar4 + ((ulong)(uVar9 + 1) - 1) + -(ulong)uVar11;
        memcpy(pcVar10,pcVar7,(ulong)uVar11);
        for (; scope != (ScopeData *)0x0; scope = scope->scope) {
          pNVar1 = scope->ownerNamespace;
          if (pNVar1 != (NamespaceData *)0x0) {
            pcVar7 = (pNVar1->name).name.begin;
            iVar3 = *(int *)&(pNVar1->name).name.end;
            pcVar10[-1] = '.';
            uVar8 = (ulong)(uint)(iVar3 - (int)pcVar7);
            pcVar10 = pcVar10 + (-1 - uVar8);
            memcpy(pcVar10,pcVar7,uVar8);
          }
        }
        if (pcVar10 != pcVar4) {
          __assert_fail("pos == name",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                        ,0x28f,
                        "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                       );
        }
        sVar5 = strlen(pcVar4);
        pcVar10 = pcVar4 + sVar5;
        pcVar7 = pcVar4;
      }
    }
  }
  else {
    uVar9 = (int)str.end - (int)str.begin;
    uVar8 = (ulong)((*(int *)&(parentType->name).end - *(int *)&(parentType->name).begin) +
                    uVar9 + isAccessor + 3);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar8);
    pcVar4 = (char *)CONCAT44(extraout_var,iVar3);
    pcVar10 = (parentType->name).begin;
    pcVar12 = "";
    if (isAccessor) {
      pcVar12 = "$";
    }
    NULLC::SafeSprintf(pcVar4,uVar8,"%.*s::%.*s%s",
                       (ulong)(uint)(*(int *)&(parentType->name).end - (int)pcVar10),pcVar10,
                       (ulong)uVar9,pcVar7,pcVar12);
    sVar5 = strlen(pcVar4);
    if (sVar5 + 1 != uVar8) {
      __assert_fail("strlen(name) + 1 == nameLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x24f,
                    "InplaceStr GetFunctionNameInScope(ExpressionContext &, ScopeData *, TypeBase *, InplaceStr, bool, bool)"
                   );
    }
    pcVar10 = pcVar4 + sVar5;
    pcVar7 = pcVar4;
  }
LAB_00206c7c:
  IVar13.end = pcVar10;
  IVar13.begin = pcVar7;
  return IVar13;
}

Assistant:

InplaceStr GetFunctionNameInScope(ExpressionContext &ctx, ScopeData *scope, TypeBase *parentType, InplaceStr str, bool isOperator, bool isAccessor)
{
	if(parentType)
	{
		unsigned nameLength = parentType->name.length() + 2 + str.length() + (isAccessor ? 1 : 0) + 1;
		char *name = (char*)ctx.allocator->alloc(nameLength);

		NULLC::SafeSprintf(name, nameLength, "%.*s::%.*s%s", FMT_ISTR(parentType->name), FMT_ISTR(str), isAccessor ? "$" : "");

		assert(strlen(name) + 1 == nameLength);
		return InplaceStr(name);
	}

	if(isOperator)
		return str;

	assert(!isAccessor);

	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		// Temporary scope is not evaluated
		if(curr->type == SCOPE_TEMPORARY)
			return str;

		// Function scope, just use the name
		if(curr->ownerFunction && !foundNamespace)
			return str;

		if(curr->ownerType)
			assert(foundNamespace);

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	pos -= str.length();
	memcpy(pos, str.begin, str.length());

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}